

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::KcpConnection::connectDestroyed(KcpConnection *this)

{
  __shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state == kConnected) {
    this->m_state = kDisconnected;
    std::__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::KcpConnection,void>
              (local_30,(__weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator()
              (&this->m_kcpConnectionCallback,(shared_ptr<sznet::net::KcpConnection> *)local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  return;
}

Assistant:

void KcpConnection::connectDestroyed()
{
	m_loop->assertInLoopThread();
	if (m_state == kConnected)
	{
		setState(kDisconnected);
		m_kcpConnectionCallback(shared_from_this());
	}
}